

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::NewGap(FlowBuffer *this,int length)

{
  int iVar1;
  int iVar2;
  
  ClearPreviousData(this);
  if ((this->chunked_ == true) && (-1 < this->frame_length_)) {
    iVar1 = this->frame_length_ - length;
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    this->frame_length_ = iVar2;
  }
  this->orig_data_begin_ = (const_byteptr)0x0;
  this->orig_data_end_ = (const_byteptr)0x0;
  MarkOrCopy(this);
  return;
}

Assistant:

void FlowBuffer::NewGap(int length)
	{
	ClearPreviousData();

	if ( chunked_ && frame_length_ >= 0 )
		{
		frame_length_ -= length;
		if ( frame_length_ < 0 )
			frame_length_ = 0;
		}

	orig_data_begin_ = orig_data_end_ = nullptr;
	MarkOrCopy();
	}